

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O2

FT_Module_Interface ft_svg_get_interface(FT_Module module,char *ft_svg_interface)

{
  FT_Pointer pvVar1;
  
  pvVar1 = ft_service_list_lookup(ft_svg_services,ft_svg_interface);
  return pvVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_Module_Interface )
  ft_svg_get_interface( FT_Module    module,
                        const char*  ft_svg_interface )
  {
    FT_Module_Interface  result;


    FT_UNUSED( module );

    result = ft_service_list_lookup( ft_svg_services, ft_svg_interface );
    if ( result )
      return result;

    return 0;
  }